

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_input_feedback_state_iterator_t
xcb_input_get_feedback_control_feedbacks_iterator(xcb_input_get_feedback_control_reply_t *R)

{
  xcb_input_feedback_state_iterator_t xVar1;
  long in_RDI;
  long in_FS_OFFSET;
  xcb_input_feedback_state_iterator_t i;
  undefined4 local_20;
  undefined4 local_18;
  
  local_18 = (int)(xcb_input_feedback_state_t *)(in_RDI + 0x20);
  local_20 = (int)in_RDI;
  xVar1.index = local_18 - local_20;
  xVar1.rem = (uint)*(ushort *)(in_RDI + 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    xVar1.data = (xcb_input_feedback_state_t *)(in_RDI + 0x20);
    return xVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_input_feedback_state_iterator_t
xcb_input_get_feedback_control_feedbacks_iterator (const xcb_input_get_feedback_control_reply_t *R)
{
    xcb_input_feedback_state_iterator_t i;
    i.data = (xcb_input_feedback_state_t *) (R + 1);
    i.rem = R->num_feedbacks;
    i.index = (char *) i.data - (char *) R;
    return i;
}